

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhostinfo.cpp
# Opt level: O1

QHostInfo __thiscall QHostInfo::fromName(QHostInfo *this,QString *name)

{
  Type *this_00;
  QGlobalStatic<QtGlobalStatic::ApplicationHolder<(anonymous_namespace)::(anonymous_namespace)::Q_QAS_theHostInfoLookupManager>_>
  *this_01;
  
  this->d_ptr = (QHostInfoPrivate *)&DAT_aaaaaaaaaaaaaaaa;
  this_01 = (QGlobalStatic<QtGlobalStatic::ApplicationHolder<(anonymous_namespace)::(anonymous_namespace)::Q_QAS_theHostInfoLookupManager>_>
             *)this;
  QHostInfoAgent::fromName((QHostInfoAgent *)this,name);
  this_00 = QGlobalStatic<QtGlobalStatic::ApplicationHolder<(anonymous_namespace)::(anonymous_namespace)::Q_QAS_theHostInfoLookupManager>_>
            ::operator()(this_01);
  QHostInfoCache::put(&this_00->cache,name,this);
  return (QHostInfo)(QHostInfoPrivate *)this;
}

Assistant:

QHostInfo QHostInfo::fromName(const QString &name)
{
#if defined QHOSTINFO_DEBUG
    qDebug("QHostInfo::fromName(\"%s\")",name.toLatin1().constData());
#endif

#ifdef Q_OS_WASM
    return QHostInfoAgent::lookup(name);
#else
    QHostInfo hostInfo = QHostInfoAgent::fromName(name);
    QHostInfoLookupManager* manager = theHostInfoLookupManager();
    manager->cache.put(name, hostInfo);
    return hostInfo;
#endif
}